

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

void __thiscall
cimod::BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse>::_initialize_quadmat
          (BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse> *this,SparseMatrix *mat,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *labels_vec)

{
  StorageIndex *pSVar1;
  Index IVar2;
  Scalar *pSVar3;
  StorageIndex *pSVar4;
  pointer puVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  size_t __n;
  ActualDstType actualDst;
  pointer puVar8;
  mapped_type mVar9;
  long lVar10;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  labels;
  allocator_type local_72;
  undefined1 local_71;
  void *local_70 [2];
  long local_60;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_58;
  
  if ((mat->super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>).
      super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue == true) {
    pSVar1 = (this->_quadmat).m_outerIndex;
    (this->_quadmat).m_outerIndex = mat->m_outerIndex;
    mat->m_outerIndex = pSVar1;
    IVar2 = (this->_quadmat).m_innerSize;
    (this->_quadmat).m_innerSize = mat->m_innerSize;
    mat->m_innerSize = IVar2;
    IVar2 = (this->_quadmat).m_outerSize;
    (this->_quadmat).m_outerSize = mat->m_outerSize;
    mat->m_outerSize = IVar2;
    pSVar1 = (this->_quadmat).m_innerNonZeros;
    (this->_quadmat).m_innerNonZeros = mat->m_innerNonZeros;
    mat->m_innerNonZeros = pSVar1;
    pSVar3 = (this->_quadmat).m_data.m_values;
    (this->_quadmat).m_data.m_values = (mat->m_data).m_values;
    (mat->m_data).m_values = pSVar3;
    pSVar4 = (this->_quadmat).m_data.m_indices;
    (this->_quadmat).m_data.m_indices = (mat->m_data).m_indices;
    (mat->m_data).m_indices = pSVar4;
    IVar2 = (this->_quadmat).m_data.m_size;
    (this->_quadmat).m_data.m_size = (mat->m_data).m_size;
    (mat->m_data).m_size = IVar2;
    IVar2 = (this->_quadmat).m_data.m_allocatedSize;
    (this->_quadmat).m_data.m_allocatedSize = (mat->m_data).m_allocatedSize;
    (mat->m_data).m_allocatedSize = IVar2;
  }
  else if (this != (BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse> *)mat) {
    Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
              ((SparseMatrix<double,1,int> *)this,mat);
    if (mat->m_innerNonZeros == (StorageIndex *)0x0) {
      __n = (this->_quadmat).m_outerSize * 4 + 4;
      if (__n != 0) {
        memcpy((this->_quadmat).m_outerIndex,mat->m_outerIndex,__n);
      }
      Eigen::internal::CompressedStorage<double,_int>::operator=
                (&(this->_quadmat).m_data,&mat->m_data);
    }
    else {
      Eigen::internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                (&this->_quadmat,mat);
    }
  }
  std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_58,
             (labels_vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
             .super__Vector_impl_data._M_start,
             (labels_vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
             .super__Vector_impl_data._M_finish,0,local_70,&local_72,&local_71);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  vector<std::__detail::_Node_iterator<unsigned_long,true,false>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_70,
             (_Node_iterator<unsigned_long,_true,_false>)local_58._M_before_begin._M_nxt,
             (_Node_iterator<unsigned_long,_true,_false>)0x0,&local_72);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->_idx_to_label,local_70);
  if (local_70[0] != (void *)0x0) {
    operator_delete(local_70[0],local_60 - (long)local_70[0]);
  }
  puVar8 = (this->_idx_to_label).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->_idx_to_label).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar5) {
    uVar6 = (long)puVar5 - (long)puVar8 >> 3;
    lVar10 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar8,puVar5,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar8,puVar5);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->_label_to_idx)._M_h);
  puVar8 = (this->_idx_to_label).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_idx_to_label).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar8) {
    lVar10 = 0;
    mVar9 = 0;
    do {
      pmVar7 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_label_to_idx,(key_type *)((long)puVar8 + lVar10));
      *pmVar7 = mVar9;
      mVar9 = mVar9 + 1;
      puVar8 = (this->_idx_to_label).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 8;
    } while (mVar9 < (ulong)((long)(this->_idx_to_label).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3));
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_58);
  return;
}

Assistant:

inline void _initialize_quadmat( const SparseMatrix &mat, const std::vector<IndexType> &labels_vec ) {
      this->_quadmat = mat;
      std::unordered_set<IndexType> labels( labels_vec.begin(), labels_vec.end() );
      _idx_to_label = std::vector<IndexType>( labels.begin(), labels.end() );
      std::sort( _idx_to_label.begin(), _idx_to_label.end() );
      _set_label_to_idx();
    }